

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

void Zyx_ManPrintSolution(Zyx_Man_t *p,int fCompl,int fFirst)

{
  ulong *puVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Bmc_EsPar_t *pBVar7;
  FILE *__stream;
  ulong *puVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  char local_418 [1000];
  
  pBVar7 = p->pPars;
  pcVar11 = "MAJ-gates";
  if (pBVar7->fMajority == 0) {
    pcVar11 = "LUTs";
  }
  printf("Realization of given %d-input function using %d %d-input %s:\n",(ulong)(uint)pBVar7->nVars
         ,(ulong)(uint)pBVar7->nNodes,(ulong)(uint)pBVar7->nLutSize,pcVar11);
  uVar5 = p->nObjs;
  uVar12 = uVar5;
  while( true ) {
    uVar5 = uVar5 - 1;
    uVar9 = 0;
    if (0 < (int)uVar5) {
      uVar9 = uVar5;
    }
    uVar13 = p->pPars->nVars;
    if ((int)uVar12 <= (int)uVar13) break;
    printf("%02d = ");
    if (p->pPars->fMajority == 0) {
      printf("%d\'b",(ulong)(uint)(1 << ((byte)p->pPars->nLutSize & 0x1f)));
      for (iVar4 = p->LutMask; -1 < iVar4; iVar4 = iVar4 + -1) {
        uVar13 = bmcg_sat_solver_read_cex_varvalue
                           (p->pSat,(uVar5 - p->pPars->nVars) * (p->LutMask + 1) + iVar4);
        printf("%d",(ulong)((uVar12 == p->nObjs && fCompl != 0) ^ uVar13));
      }
    }
    else {
      printf("MAJ3");
    }
    putchar(0x28);
    for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
      iVar4 = bmcg_sat_solver_read_cex_varvalue
                        (p->pSat,(uVar5 - p->pPars->nVars) * p->nObjs + p->TopoBase + uVar13);
      if (iVar4 != 0) {
        if ((int)uVar13 < p->pPars->nVars) {
          pcVar11 = " %c";
          uVar3 = uVar13 + 0x61;
        }
        else {
          pcVar11 = " %02d";
          uVar3 = uVar13;
        }
        printf(pcVar11,(ulong)uVar3);
      }
    }
    puts(" )");
    uVar12 = uVar12 - 1;
  }
  if (p->pPars->fMajority == 0) {
    if (fCompl != 0) {
      iVar4 = 1 << ((char)uVar13 - 6U & 0x1f);
      if ((int)uVar13 < 7) {
        iVar4 = 1;
      }
      Abc_TtNot(p->pTruth,iVar4);
      uVar13 = p->pPars->nVars;
    }
    if ((int)uVar13 < 2) {
      __assert_fail("nVars >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x4f1,"int Abc_TtWriteHexRev(char *, word *, int)");
    }
    puVar1 = p->pTruth;
    iVar4 = 1 << ((char)uVar13 - 6U & 0x1f);
    if (uVar13 < 7) {
      iVar4 = 1;
    }
    puVar8 = puVar1 + iVar4;
    uVar5 = 0xf;
    if (uVar13 < 6) {
      uVar5 = ~(-1 << ((char)uVar13 - 2U & 0x1f));
    }
    pcVar11 = local_418;
    while (puVar8 = puVar8 + -1, iVar4 = uVar5 * 4, uVar12 = uVar5, puVar1 <= puVar8) {
      for (; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
        uVar9 = (uint)(*puVar8 >> ((byte)iVar4 & 0x3f)) & 0xf;
        cVar2 = '7';
        if (uVar9 < 10) {
          cVar2 = '0';
        }
        *pcVar11 = cVar2 + (char)uVar9;
        pcVar11 = pcVar11 + 1;
        iVar4 = iVar4 + -4;
      }
    }
    pBVar7 = p->pPars;
    if (fCompl != 0) {
      iVar4 = 1 << ((char)pBVar7->nVars - 6U & 0x1f);
      if (pBVar7->nVars < 7) {
        iVar4 = 1;
      }
      Abc_TtNot(p->pTruth,iVar4);
      pBVar7 = p->pPars;
    }
    sprintf(local_418 + (1 << ((char)pBVar7->nVars - 2U & 0x1f)),"-%d-%d.bool",
            (ulong)(uint)pBVar7->nLutSize,(ulong)(uint)pBVar7->nNodes);
    pcVar11 = "wb";
    if (fFirst == 0) {
      pcVar11 = "ab";
    }
    __stream = fopen(local_418,pcVar11);
    if (__stream == (FILE *)0x0) {
      pcVar11 = "Cannot open input file \"%s\".\n";
    }
    else {
      iVar4 = p->pPars->nVars;
      while( true ) {
        iVar14 = 0;
        if (0 < iVar4) {
          iVar14 = iVar4;
        }
        if (p->nObjs <= iVar4) break;
        fputc(iVar4 + 0x41,__stream);
        if (p->pPars->fMajority == 0) {
          for (iVar10 = p->LutMask; -1 < iVar10; iVar10 = iVar10 + -1) {
            uVar5 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,(iVar4 - p->pPars->nVars) * (p->LutMask + 1) + iVar10);
            fprintf(__stream,"%d",(ulong)((iVar4 == p->nObjs + -1 && fCompl != 0) ^ uVar5));
          }
          for (iVar10 = 0; iVar14 != iVar10; iVar10 = iVar10 + 1) {
            iVar6 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,(iVar4 - p->pPars->nVars) * p->nObjs + p->TopoBase + iVar10);
            if (iVar6 != 0) {
              fputc((uint)(iVar10 < p->pPars->nVars) * 0x20 + iVar10 + 0x41,__stream);
            }
          }
        }
        else {
          fwrite("maj3",4,1,__stream);
        }
        fputc(10,__stream);
        iVar4 = iVar4 + 1;
      }
      fputc(10,__stream);
      fclose(__stream);
      pcVar11 = "Dumped solution into file \"%s\".\n";
    }
    printf(pcVar11,local_418);
  }
  return;
}

Assistant:

static void Zyx_ManPrintSolution( Zyx_Man_t * p, int fCompl, int fFirst )
{
    int i, k;
    printf( "Realization of given %d-input function using %d %d-input %s:\n", 
        p->pPars->nVars, p->pPars->nNodes, p->pPars->nLutSize, p->pPars->fMajority ? "MAJ-gates" : "LUTs" );
    for ( i = p->nObjs - 1; i >= p->pPars->nVars; i-- )
    {
        printf( "%02d = ", i );
        if ( p->pPars->fMajority )
            printf( "MAJ3" );
        else
        {
            printf( "%d\'b", 1 << p->pPars->nLutSize );
            for ( k = p->LutMask; k >= 0; k-- )
                printf( "%d", bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i, k)) ^ (i == p->nObjs - 1 && fCompl) );
        }
        printf( "(" );
        for ( k = 0; k < i; k++ )
            if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i, k)) )
            {
                if ( k >= 0 && k < p->pPars->nVars )
                    printf( " %c", 'a'+k );
                else
                    printf( " %02d", k );
            }
        printf( " )\n" );
    }
    if ( !p->pPars->fMajority )
        Zyx_ManPrintSolutionFile( p, fCompl, fFirst );
}